

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void rtc::LogMultiline(LoggingSeverity level,char *label,bool input,void *data,size_t len,
                      bool hex_mode,LogMultilineState *state)

{
  byte *pbVar1;
  void *pvVar2;
  void *pvVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  char *pcVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  char hex_line [56];
  char asc_line [25];
  char *in_stack_fffffffffffffd68;
  undefined8 local_258;
  long lStack_250;
  char local_248 [32];
  ulong local_228;
  ulong local_220;
  byte local_218 [17];
  ulong uStack_207;
  LogMessage local_1f0;
  
  if (LogMessage::min_sev_ <= (int)level) {
    pcVar15 = " >> ";
    if (input) {
      pcVar15 = " << ";
    }
    if (data == (void *)0x0) {
      if ((state != (LogMultilineState *)0x0) && (*(long *)(state + (ulong)input * 8) != 0)) {
        LogMessage::LogMessage
                  (&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                   ,0x1c2,level,ERRCTX_NONE,0,in_stack_fffffffffffffd68);
        if (label == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffd68 +
                          (int)*(undefined8 *)(local_1f0._0_8_ + -0x18) + 0xa8);
        }
        else {
          sVar7 = strlen(label);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,label,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar15,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"## ",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," consecutive unprintable ##",0x1b);
        LogMessage::~LogMessage(&local_1f0);
        *(undefined8 *)(state + (ulong)input * 8) = 0;
      }
    }
    else if (hex_mode) {
      if (len != 0) {
        do {
          local_218[0x10] = 0x20;
          uStack_207 = 0x2020202020202020;
          local_218[0] = 0x20;
          local_218[1] = 0x20;
          local_218[2] = 0x20;
          local_218[3] = 0x20;
          local_218[4] = 0x20;
          local_218[5] = 0x20;
          local_218[6] = 0x20;
          local_218[7] = 0x20;
          local_218[8] = 0x20;
          local_218[9] = 0x20;
          local_218[10] = 0x20;
          local_218[0xb] = 0x20;
          local_218[0xc] = 0x20;
          local_218[0xd] = 0x20;
          local_218[0xe] = 0x20;
          local_218[0xf] = 0x20;
          local_258 = (char *)0x2020202020202020;
          lStack_250 = 0x2020202020202020;
          builtin_strncpy(local_248,"                                ",0x20);
          local_228 = 0x2020202020202020;
          uVar18 = 0x18;
          if (len < 0x18) {
            uVar18 = len;
          }
          uVar16 = 0;
          do {
            bVar4 = *(byte *)((long)data + uVar16);
            iVar6 = isprint((uint)bVar4);
            if (iVar6 == 0) {
              bVar4 = 0x2e;
            }
            local_218[uVar16] = bVar4;
            cVar5 = hex_encode('\0');
            *(char *)((long)&local_258 + uVar16 * 2 + (uVar16 >> 2)) = cVar5;
            cVar5 = hex_encode('\0');
            *(char *)((long)&local_258 + uVar16 * 2 + (uVar16 >> 2) + 1) = cVar5;
            uVar16 = uVar16 + 1;
          } while (uVar18 + (uVar18 == 0) != uVar16);
          uStack_207 = uStack_207 & 0xffffffffffffff;
          local_228 = local_228 & 0xffffffffffffff;
          if (LogMessage::min_sev_ <= (int)level) {
            LogMessage::LogMessage
                      (&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                       ,0x1dc,level,ERRCTX_NONE,0,in_stack_fffffffffffffd68);
            if (label == (char *)0x0) {
              std::ios::clear((int)&stack0xfffffffffffffd68 +
                              (int)*(undefined8 *)(local_1f0._0_8_ + -0x18) + 0xa8);
            }
            else {
              sVar7 = strlen(label);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,label,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar15,4);
            sVar7 = strlen((char *)local_218);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0,(char *)local_218,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," ",1);
            sVar7 = strlen((char *)&local_258);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0,(char *)&local_258,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0," ",1);
            LogMessage::~LogMessage(&local_1f0);
          }
          data = (void *)((long)data + uVar18);
          len = len - uVar18;
        } while (len != 0);
      }
    }
    else {
      local_220 = (ulong)input;
      if (state == (LogMultilineState *)0x0) {
        lVar9 = 0;
      }
      else {
        lVar9 = *(long *)(state + local_220 * 8);
      }
      if (0 < (long)len) {
        pvVar17 = (void *)(len + (long)data);
        do {
          lVar13 = 0;
          do {
            if (*(char *)((long)data + lVar13) == '\0') break;
            if (*(char *)((long)data + lVar13) == '\n') {
              pvVar14 = (void *)(lVar13 + (long)data);
              goto LAB_0013cf80;
            }
            lVar13 = lVar13 + 1;
          } while ((long)pvVar17 - (long)data != lVar13);
          pvVar14 = (void *)0x0;
LAB_0013cf80:
          pvVar2 = (void *)((long)pvVar14 + 1);
          if (pvVar14 == (void *)0x0) {
            pvVar14 = pvVar17;
            pvVar2 = pvVar17;
          }
          if ((lVar9 == 0) || (3 < (long)pvVar14 - (long)data)) {
            bVar11 = true;
            if (data < pvVar14) {
              lVar13 = 0;
              do {
                bVar4 = *(byte *)((long)data + lVar13);
                iVar6 = isspace((uint)bVar4);
                if (iVar6 == 0) {
                  iVar6 = isprint((uint)bVar4);
                  bVar11 = false;
                  bVar10 = false;
                  if (iVar6 == 0) goto LAB_0013cff2;
                }
                lVar13 = lVar13 + 1;
              } while ((long)pvVar14 - (long)data != lVar13);
              bVar10 = (bool)(bVar11 ^ 1);
              bVar11 = true;
            }
            else {
              bVar10 = false;
            }
LAB_0013cff2:
            if (lVar9 != 0) {
              bVar11 = bVar10;
            }
            if (!bVar11) goto LAB_0013d074;
            pvVar3 = pvVar14;
            if ((lVar9 != 0) && (LogMessage::min_sev_ <= (int)level)) {
              LogMessage::LogMessage
                        (&local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                         ,0x212,level,ERRCTX_NONE,0,in_stack_fffffffffffffd68);
              if (label == (char *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffd68 +
                                (int)*(undefined8 *)(local_1f0._0_8_ + -0x18) + 0xa8);
              }
              else {
                sVar7 = strlen(label);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1f0,label,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar15,4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"## ",3);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," consecutive unprintable ##",0x1b);
              LogMessage::~LogMessage(&local_1f0);
            }
            do {
              pvVar12 = pvVar3;
              if (pvVar14 <= data) break;
              pbVar1 = (byte *)((long)pvVar14 + -1);
              pvVar14 = (void *)((long)pvVar14 + -1);
              iVar6 = isspace((uint)*pbVar1);
              pvVar3 = (void *)((long)pvVar12 + -1);
            } while (iVar6 != 0);
            local_258 = local_248;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,data,pvVar12);
            lVar9 = std::__cxx11::string::find((char *)&local_258,0x19bc4b,0);
            if ((lVar9 == -1) &&
               (lVar9 = std::__cxx11::string::find((char *)&local_258,0x19bc51,0), lVar9 == -1)) {
              if (LogMessage::min_sev_ <= (int)level) {
                LogMessage::LogMessage
                          (&local_1f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                           ,0x221,level,ERRCTX_NONE,0,in_stack_fffffffffffffd68);
                if (label == (char *)0x0) {
                  std::ios::clear((int)&stack0xfffffffffffffd68 +
                                  (int)*(undefined8 *)(local_1f0._0_8_ + -0x18) + 0xa8);
                }
                else {
                  sVar7 = strlen(label);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1f0,label,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar15,4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1f0,local_258,lStack_250);
LAB_0013d203:
                LogMessage::~LogMessage(&local_1f0);
              }
            }
            else if (LogMessage::min_sev_ <= (int)level) {
              LogMessage::LogMessage
                        (&local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                         ,0x223,level,ERRCTX_NONE,0,in_stack_fffffffffffffd68);
              if (label == (char *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffd68 +
                                (int)*(undefined8 *)(local_1f0._0_8_ + -0x18) + 0xa8);
              }
              else {
                sVar7 = strlen(label);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1f0,label,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar15,4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1f0,"## omitted for privacy ##",0x19);
              goto LAB_0013d203;
            }
            if (local_258 != local_248) {
              operator_delete(local_258);
            }
            lVar9 = 0;
          }
          else {
LAB_0013d074:
            lVar9 = (lVar9 - (long)data) + (long)pvVar2;
          }
          data = pvVar2;
        } while (pvVar2 < pvVar17);
      }
      if (state != (LogMultilineState *)0x0) {
        *(long *)(state + local_220 * 8) = lVar9;
      }
    }
  }
  return;
}

Assistant:

void LogMultiline(LoggingSeverity level, const char* label, bool input,
                  const void* data, size_t len, bool hex_mode,
                  LogMultilineState* state) {
  if (!LOG_CHECK_LEVEL_V(level))
    return;

  const char * direction = (input ? " << " : " >> ");

  // NULL data means to flush our count of unprintable characters.
  if (!data) {
    if (state && state->unprintable_count_[input]) {
      LOG_V(level) << label << direction << "## "
                   << state->unprintable_count_[input]
                   << " consecutive unprintable ##";
      state->unprintable_count_[input] = 0;
    }
    return;
  }

  // The ctype classification functions want unsigned chars.
  const unsigned char* udata = static_cast<const unsigned char*>(data);

  if (hex_mode) {
    const size_t LINE_SIZE = 24;
    char hex_line[LINE_SIZE * 9 / 4 + 2], asc_line[LINE_SIZE + 1];
    while (len > 0) {
      memset(asc_line, ' ', sizeof(asc_line));
      memset(hex_line, ' ', sizeof(hex_line));
      size_t line_len = std::min(len, LINE_SIZE);
      for (size_t i = 0; i < line_len; ++i) {
        unsigned char ch = udata[i];
        asc_line[i] = isprint(ch) ? ch : '.';
        hex_line[i*2 + i/4] = hex_encode(ch >> 4);
        hex_line[i*2 + i/4 + 1] = hex_encode(ch & 0xf);
      }
      asc_line[sizeof(asc_line)-1] = 0;
      hex_line[sizeof(hex_line)-1] = 0;
      LOG_V(level) << label << direction
                   << asc_line << " " << hex_line << " ";
      udata += line_len;
      len -= line_len;
    }
    return;
  }

  size_t consecutive_unprintable = state ? state->unprintable_count_[input] : 0;

  const unsigned char* end = udata + len;
  while (udata < end) {
    const unsigned char* line = udata;
    const unsigned char* end_of_line = strchrn<unsigned char>(udata,
                                                              end - udata,
                                                              '\n');
    if (!end_of_line) {
      udata = end_of_line = end;
    } else {
      udata = end_of_line + 1;
    }

    bool is_printable = true;

    // If we are in unprintable mode, we need to see a line of at least
    // kMinPrintableLine characters before we'll switch back.
    const ptrdiff_t kMinPrintableLine = 4;
    if (consecutive_unprintable && ((end_of_line - line) < kMinPrintableLine)) {
      is_printable = false;
    } else {
      // Determine if the line contains only whitespace and printable
      // characters.
      bool is_entirely_whitespace = true;
      for (const unsigned char* pos = line; pos < end_of_line; ++pos) {
        if (isspace(*pos))
          continue;
        is_entirely_whitespace = false;
        if (!isprint(*pos)) {
          is_printable = false;
          break;
        }
      }
      // Treat an empty line following unprintable data as unprintable.
      if (consecutive_unprintable && is_entirely_whitespace) {
        is_printable = false;
      }
    }
    if (!is_printable) {
      consecutive_unprintable += (udata - line);
      continue;
    }
    // Print out the current line, but prefix with a count of prior unprintable
    // characters.
    if (consecutive_unprintable) {
      LOG_V(level) << label << direction << "## " << consecutive_unprintable
                  << " consecutive unprintable ##";
      consecutive_unprintable = 0;
    }
    // Strip off trailing whitespace.
    while ((end_of_line > line) && isspace(*(end_of_line-1))) {
      --end_of_line;
    }
    // Filter out any private data
    std::string substr(reinterpret_cast<const char*>(line), end_of_line - line);
    std::string::size_type pos_private = substr.find("Email");
    if (pos_private == std::string::npos) {
      pos_private = substr.find("Passwd");
    }
    if (pos_private == std::string::npos) {
      LOG_V(level) << label << direction << substr;
    } else {
      LOG_V(level) << label << direction << "## omitted for privacy ##";
    }
  }

  if (state) {
    state->unprintable_count_[input] = consecutive_unprintable;
  }
}